

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderIncompleteProgramObjectsTest::initTestRuns
          (GeometryShaderIncompleteProgramObjectsTest *this)

{
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  *this_00;
  pointer *pp_Var1;
  iterator iVar2;
  _run local_1c;
  _run local_19;
  _run local_16;
  _run local_13;
  
  this_00 = &this->m_test_runs;
  local_13.use_fs = false;
  local_13.use_gs = true;
  local_13.use_separable_po = false;
  iVar2._M_current =
       (this->m_test_runs).
       super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>
              (this_00,iVar2,&local_13);
    iVar2._M_current =
         (this->m_test_runs).
         super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar2._M_current)->use_separable_po = false;
    (iVar2._M_current)->use_fs = false;
    (iVar2._M_current)->use_gs = true;
    iVar2._M_current =
         (this->m_test_runs).
         super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_test_runs).
    super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_16.use_fs = false;
  local_16.use_gs = true;
  local_16.use_separable_po = true;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>
              (this_00,iVar2,&local_16);
    iVar2._M_current =
         (this->m_test_runs).
         super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar2._M_current)->use_separable_po = true;
    (iVar2._M_current)->use_fs = false;
    (iVar2._M_current)->use_gs = true;
    iVar2._M_current =
         (this->m_test_runs).
         super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_test_runs).
    super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_19.use_fs = true;
  local_19.use_gs = true;
  local_19.use_separable_po = false;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>
              (this_00,iVar2,&local_19);
    iVar2._M_current =
         (this->m_test_runs).
         super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar2._M_current)->use_separable_po = false;
    (iVar2._M_current)->use_fs = true;
    (iVar2._M_current)->use_gs = true;
    iVar2._M_current =
         (this->m_test_runs).
         super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_test_runs).
    super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_1c.use_fs = true;
  local_1c.use_gs = true;
  local_1c.use_separable_po = true;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>
              (this_00,iVar2,&local_1c);
  }
  else {
    (iVar2._M_current)->use_separable_po = true;
    (iVar2._M_current)->use_fs = true;
    (iVar2._M_current)->use_gs = true;
    pp_Var1 = &(this->m_test_runs).
               super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  return;
}

Assistant:

void GeometryShaderIncompleteProgramObjectsTest::initTestRuns()
{
	/*                         use_fs| use_gs| use_separable_po
	 *                         ------|-------|-----------------*/
	m_test_runs.push_back(_run(false, true, false));
	m_test_runs.push_back(_run(false, true, true));
	m_test_runs.push_back(_run(true, true, false));
	m_test_runs.push_back(_run(true, true, true));
}